

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

namespace_t * __thiscall cs_impl::any::get_ext(any *this)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  string local_38;
  
  if (this->mDat != (proxy *)0x0) {
    iVar1 = (*this->mDat->data->_vptr_baseHolder[10])();
    return (namespace_t *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Type doesn\'t have extension field.","");
  cs::runtime_error::runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

cs::namespace_t &get_ext() const
		{
			if (this->mDat == nullptr)
				throw cs::runtime_error("Type doesn't have extension field.");
			return this->mDat->data->get_ext();
		}